

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Maybe
          (Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *this,
          Maybe<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *other)

{
  byte bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = (bool)bVar1;
  if ((bool)bVar1 == true) {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
              (&(this->ptr).field_1.value,&(other->ptr).field_1.value);
    bVar1 = (other->ptr).isSet;
  }
  if ((bVar1 & 1) != 0) {
    (other->ptr).isSet = false;
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy
              (&(other->ptr).field_1.value);
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }